

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O2

void __thiscall
DefaultIndexFixture_InsertSingleIterator_Test::~DefaultIndexFixture_InsertSingleIterator_Test
          (DefaultIndexFixture_InsertSingleIterator_Test *this)

{
  anon_unknown.dwarf_13be9a::DefaultIndexFixture::~DefaultIndexFixture
            (&this->super_DefaultIndexFixture);
  operator_delete(this,0x160);
  return;
}

Assistant:

TEST_F (DefaultIndexFixture, InsertSingleIterator) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    auto const first = std::make_pair ("a"s, "b"s);
    index_->insert_or_assign (t1, first);

    default_index::iterator begin = index_->begin (db_);
    default_index::iterator end = index_->end (db_);
    EXPECT_NE (begin, end);
    std::string const & v1 = (*begin).first;
    EXPECT_EQ (first.first, v1);
    ++begin;
    EXPECT_EQ (begin, end);
}